

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int64_t roundAndPackInt64(flag zSign,uint64_t absZ0,uint64_t absZ1,float_status *status)

{
  bool local_4b;
  bool local_4a;
  bool local_49;
  uint64_t local_40;
  int64_t z;
  flag increment;
  flag roundNearestEven;
  int8_t roundingMode;
  float_status *status_local;
  uint64_t absZ1_local;
  uint64_t absZ0_local;
  int64_t iStack_10;
  flag zSign_local;
  
  switch(status->float_rounding_mode) {
  case '\0':
  case '\x04':
    local_4b = (long)absZ1 < 0;
    break;
  case '\x01':
    local_4a = zSign != '\0' && absZ1 != 0;
    local_4b = local_4a;
    break;
  case '\x02':
    local_49 = zSign == '\0' && absZ1 != 0;
    local_4b = local_49;
    break;
  case '\x03':
    local_4b = false;
    break;
  case '\x05':
    local_4b = (absZ0 & 1) == 0 && absZ1 != 0;
    break;
  default:
    abort();
  }
  absZ1_local = absZ0;
  if (local_4b) {
    if (absZ0 + 1 == 0) goto LAB_012c530f;
    absZ1_local = (long)(int)(((absZ1 & 0x7fffffffffffffff) == 0 &&
                              status->float_rounding_mode == '\0') ^ 0xffffffff) & absZ0 + 1;
  }
  local_40 = absZ1_local;
  if (zSign != '\0') {
    local_40 = -absZ1_local;
  }
  if ((local_40 == 0) || ((long)local_40 < 0 == (bool)zSign)) {
    if (absZ1 != 0) {
      status->float_exception_flags = status->float_exception_flags | 0x20;
    }
    return local_40;
  }
LAB_012c530f:
  float_raise_tricore('\x01',status);
  iStack_10 = 0x7fffffffffffffff;
  if (zSign != '\0') {
    iStack_10 = -0x8000000000000000;
  }
  return iStack_10;
}

Assistant:

static int64_t roundAndPackInt64(flag zSign, uint64_t absZ0, uint64_t absZ1,
                               float_status *status)
{
    int8_t roundingMode;
    flag roundNearestEven, increment;
    int64_t z;

    roundingMode = status->float_rounding_mode;
    roundNearestEven = ( roundingMode == float_round_nearest_even );
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        increment = ((int64_t) absZ1 < 0);
        break;
    case float_round_to_zero:
        increment = 0;
        break;
    case float_round_up:
        increment = !zSign && absZ1;
        break;
    case float_round_down:
        increment = zSign && absZ1;
        break;
    case float_round_to_odd:
        increment = !(absZ0 & 1) && absZ1;
        break;
    default:
        abort();
    }
    if ( increment ) {
        ++absZ0;
        if ( absZ0 == 0 ) goto overflow;
        absZ0 &= ~ ( ( (uint64_t) ( absZ1<<1 ) == 0 ) & roundNearestEven );
    }
    z = absZ0;
    if ( zSign ) z = - z;
    if ( z && ( ( z < 0 ) ^ zSign ) ) {
 overflow:
        float_raise(float_flag_invalid, status);
        return zSign ? INT64_MIN : INT64_MAX;
    }
    if (absZ1) {
        status->float_exception_flags |= float_flag_inexact;
    }
    return z;

}